

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::keepFilesOpen(Config *this,string *parameter)

{
  bool bVar1;
  element_type *peVar2;
  string *parameter_local;
  Config *this_local;
  
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  peVar2->keep_files_open_set = true;
  bVar1 = std::operator==(parameter,"y");
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  peVar2->keep_files_open = bVar1;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::keepFilesOpen(std::string const& parameter)
{
    o.m->keep_files_open_set = true;
    o.m->keep_files_open = (parameter == "y");
    return this;
}